

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Program_FunctionsEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse>(Arena *arena)

{
  Program_FunctionsEntry_DoNotUse *pPVar1;
  
  if (arena != (Arena *)0x0) {
    pPVar1 = DoCreateMessage<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse>(arena)
    ;
    return pPVar1;
  }
  pPVar1 = (Program_FunctionsEntry_DoNotUse *)operator_new(0x28);
  CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse::Program_FunctionsEntry_DoNotUse
            (pPVar1,(Arena *)0x0);
  return pPVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }